

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSAParameters.cpp
# Opt level: O3

ByteString * __thiscall
RSAParameters::serialise(ByteString *__return_storage_ptr__,RSAParameters *this)

{
  ByteString len;
  ByteString local_88;
  ByteString local_60;
  ByteString local_38;
  
  ByteString::ByteString(&local_38,this->bitLen);
  ByteString::serialise(&local_60,&this->e);
  ByteString::serialise(&local_88,&local_38);
  operator+(__return_storage_ptr__,&local_60,&local_88);
  local_88._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_88.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_60._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_60.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_38._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_38.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return __return_storage_ptr__;
}

Assistant:

ByteString RSAParameters::serialise() const
{
	ByteString len(bitLen);

	return e.serialise() + len.serialise();
}